

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

CAmount __thiscall
wallet::anon_unknown_5::WalletImpl::getMinimumFee
          (WalletImpl *this,uint tx_bytes,CCoinControl *coin_control,int *returned_target,
          FeeReason *reason)

{
  long lVar1;
  CAmount CVar2;
  undefined4 *in_RCX;
  CCoinControl *in_RDI;
  CWallet *in_R8;
  long in_FS_OFFSET;
  CAmount result;
  FeeCalculation fee_calc;
  FeeCalculation *in_stack_ffffffffffffff38;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff48;
  undefined4 local_18;
  undefined4 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FeeCalculation::FeeCalculation(in_stack_ffffffffffffff38);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_ffffffffffffff48);
  CVar2 = GetMinimumFee(in_R8,(uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),in_RDI,
                        in_stack_ffffffffffffff38);
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = local_10;
  }
  if (in_R8 != (CWallet *)0x0) {
    *(undefined4 *)&(in_R8->super_WalletStorage)._vptr_WalletStorage = local_18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return CVar2;
  }
  __stack_chk_fail();
}

Assistant:

CAmount getMinimumFee(unsigned int tx_bytes,
        const CCoinControl& coin_control,
        int* returned_target,
        FeeReason* reason) override
    {
        FeeCalculation fee_calc;
        CAmount result;
        result = GetMinimumFee(*m_wallet, tx_bytes, coin_control, &fee_calc);
        if (returned_target) *returned_target = fee_calc.returnedTarget;
        if (reason) *reason = fee_calc.reason;
        return result;
    }